

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

bool __thiscall
QMetaMethod::invokeOnGadget
          (QMetaMethod *this,QObject *gadget,QMetaTypeInterface *param_3,char *param_4,
          undefined8 param_5,char *param_6,undefined8 param_7,QMetaType *param_8,undefined8 param_9,
          undefined8 param_10,undefined8 param_11,undefined8 param_12,undefined8 param_13,
          undefined8 param_14,undefined8 param_15,undefined8 param_16,undefined8 param_17,
          undefined8 param_18,undefined8 param_19,undefined8 param_20,undefined8 param_21,
          undefined8 param_22,undefined8 param_23,undefined8 param_24)

{
  StaticMetacallFunction p_Var1;
  int iVar2;
  int iVar3;
  char *str2;
  size_t sVar4;
  storage_type *extraout_RDX;
  char *str1;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QByteArrayView typeName;
  QMetaType local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  QArrayDataPointer<char> local_98;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = false;
  if ((gadget == (QObject *)0x0) || (bVar6 = false, this->mobj == (QMetaObject *)0x0))
  goto LAB_0026269b;
  if (param_3 == (QMetaTypeInterface *)0x0) {
LAB_002624e4:
    local_98.ptr = param_6;
    local_98.size = (qsizetype)param_8;
    local_80 = param_10;
    local_78 = param_12;
    local_70 = param_14;
    local_68 = param_16;
    local_60 = param_18;
    local_58 = param_20;
    local_50 = param_22;
    local_48 = param_24;
    iVar2 = 0xb;
    for (lVar5 = 1; lVar5 != 0xb; lVar5 = lVar5 + 1) {
      sVar4 = qstrlen((char *)(&local_98.d)[lVar5]);
      if (sVar4 == 0) {
        iVar2 = (int)lVar5;
        break;
      }
    }
    if ((int)(this->data).d[1] < iVar2) {
      local_e8 = param_7;
      local_e0 = param_9;
      local_d8 = param_11;
      local_d0 = param_13;
      local_c8 = param_15;
      local_c0 = param_17;
      local_b8 = param_19;
      local_b0 = param_21;
      local_a8 = param_23;
      p_Var1 = (this->mobj->d).static_metacall;
      bVar6 = p_Var1 != (StaticMetacallFunction)0x0;
      local_f8.d_ptr = param_3;
      local_f0 = param_5;
      if (bVar6) {
        iVar2 = anon_unknown.dwarf_641be2::QMetaMethodPrivate::ownMethodIndex
                          ((QMetaMethodPrivate *)this);
        (*p_Var1)(gadget,InvokeMetaMethod,iVar2,&local_f8.d_ptr);
      }
      goto LAB_0026269b;
    }
  }
  else {
    str2 = QMetaMethod::typeName(this);
    iVar2 = qstrcmp(param_4,str2);
    if (iVar2 == 0) goto LAB_002624e4;
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QMetaObject::normalizedType((QByteArray *)&local_98,param_4);
    str1 = local_98.ptr;
    if (local_98.ptr == (char *)0x0) {
      str1 = &QByteArray::_empty;
    }
    iVar2 = qstrcmp(str1,str2);
    if (iVar2 == 0) {
LAB_002624da:
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      goto LAB_002624e4;
    }
    iVar2 = returnType(this);
    if (iVar2 != 0) {
      typeName.m_data = extraout_RDX;
      typeName.m_size = (qsizetype)local_98.ptr;
      local_f8 = QMetaType::fromName((QMetaType *)local_98.size,typeName);
      iVar3 = QMetaType::registerHelper(&local_f8);
      if (iVar2 == iVar3) goto LAB_002624da;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  }
  bVar6 = false;
LAB_0026269b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invokeOnGadget(void *gadget,
                                 QGenericReturnArgument returnValue,
                                 QGenericArgument val0,
                                 QGenericArgument val1,
                                 QGenericArgument val2,
                                 QGenericArgument val3,
                                 QGenericArgument val4,
                                 QGenericArgument val5,
                                 QGenericArgument val6,
                                 QGenericArgument val7,
                                 QGenericArgument val8,
                                 QGenericArgument val9) const
{
   if (!gadget || !mobj)
        return false;

    // check return type
    if (returnValue.data()) {
        const char *retType = typeName();
        if (qstrcmp(returnValue.name(), retType) != 0) {
            // normalize the return value as well
            QByteArray normalized = QMetaObject::normalizedType(returnValue.name());
            if (qstrcmp(normalized.constData(), retType) != 0) {
                // String comparison failed, try compare the metatype.
                int t = returnType();
                if (t == QMetaType::UnknownType || t != QMetaType::fromName(normalized).id())
                    return false;
            }
        }
    }

    // check argument count (we don't allow invoking a method if given too few arguments)
    const char *typeNames[] = {
        returnValue.name(),
        val0.name(),
        val1.name(),
        val2.name(),
        val3.name(),
        val4.name(),
        val5.name(),
        val6.name(),
        val7.name(),
        val8.name(),
        val9.name()
    };
    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    if (paramCount <= QMetaMethodPrivate::get(this)->parameterCount())
        return false;

    // invoke!
    void *param[] = {
        returnValue.data(),
        val0.data(),
        val1.data(),
        val2.data(),
        val3.data(),
        val4.data(),
        val5.data(),
        val6.data(),
        val7.data(),
        val8.data(),
        val9.data()
    };
    int idx_relative = QMetaMethodPrivate::get(this)->ownMethodIndex();
    Q_ASSERT(QMetaObjectPrivate::get(mobj)->revision >= 6);
    QObjectPrivate::StaticMetaCallFunction callFunction = mobj->d.static_metacall;
    if (!callFunction)
        return false;
    callFunction(reinterpret_cast<QObject*>(gadget), QMetaObject::InvokeMetaMethod, idx_relative, param);
    return true;
}